

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetVectorWidthPropertiesExt
          (ze_device_handle_t hDevice,uint32_t *pCount,
          ze_device_vector_width_properties_ext_t *pVectorWidthProperties)

{
  ze_pfnDeviceGetVectorWidthPropertiesExt_t pfnGetVectorWidthPropertiesExt;
  ze_result_t result;
  ze_device_vector_width_properties_ext_t *pVectorWidthProperties_local;
  uint32_t *pCount_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetVectorWidthPropertiesExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2c0 != (code *)0x0) {
    pfnGetVectorWidthPropertiesExt._4_4_ = (*DAT_0011c2c0)(hDevice,pCount,pVectorWidthProperties);
  }
  return pfnGetVectorWidthPropertiesExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetVectorWidthPropertiesExt(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        uint32_t* pCount,                               ///< [in,out] pointer to the number of vector width properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of vector width properties available.
                                                        ///< if count is greater than the number of vector width properties
                                                        ///< available, then the driver shall update the value with the correct
                                                        ///< number of vector width properties available.
        ze_device_vector_width_properties_ext_t* pVectorWidthProperties ///< [in,out][optional][range(0, *pCount)] array of vector width properties.
                                                        ///< if count is less than the number of properties available, then the
                                                        ///< driver will return only the number requested.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVectorWidthPropertiesExt = context.zeDdiTable.Device.pfnGetVectorWidthPropertiesExt;
        if( nullptr != pfnGetVectorWidthPropertiesExt )
        {
            result = pfnGetVectorWidthPropertiesExt( hDevice, pCount, pVectorWidthProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }